

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

void ImageResizeNN(Image *image,int newWidth,int newHeight)

{
  int iVar1;
  int iVar2;
  Image image_00;
  Color *__ptr;
  void *pvVar3;
  ulong uVar4;
  void *pvVar5;
  ulong uVar6;
  int iVar7;
  undefined8 unaff_R13;
  undefined8 unaff_R14;
  undefined8 unaff_R15;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    image_00._8_8_ = unaff_R14;
    image_00.data = (void *)unaff_R13;
    image_00._16_8_ = unaff_R15;
    __ptr = LoadImageColors(image_00);
    pvVar3 = malloc((long)(newHeight * newWidth) << 2);
    if (0 < newHeight) {
      iVar1 = image->width;
      iVar2 = image->height;
      uVar4 = 0;
      pvVar5 = pvVar3;
      do {
        if (0 < newWidth) {
          iVar7 = 0;
          uVar6 = 0;
          do {
            *(Color *)((long)pvVar5 + uVar6 * 4) =
                 __ptr[(iVar7 >> 0x10) +
                       (((iVar2 << 0x10) / newHeight + 1) * (int)uVar4 >> 0x10) * iVar1];
            uVar6 = uVar6 + 1;
            iVar7 = iVar7 + (iVar1 << 0x10) / newWidth + 1;
          } while ((uint)newWidth != uVar6);
        }
        uVar4 = uVar4 + 1;
        pvVar5 = (void *)((long)pvVar5 + (ulong)(uint)newWidth * 4);
      } while (uVar4 != (uint)newHeight);
    }
    iVar1 = image->format;
    free(image->data);
    image->data = pvVar3;
    image->width = newWidth;
    image->height = newHeight;
    image->format = 7;
    ImageFormat(image,iVar1);
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void ImageResizeNN(Image *image,int newWidth,int newHeight)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    Color *pixels = LoadImageColors(*image);
    Color *output = (Color *)RL_MALLOC(newWidth*newHeight*sizeof(Color));

    // EDIT: added +1 to account for an early rounding problem
    int xRatio = (int)((image->width << 16)/newWidth) + 1;
    int yRatio = (int)((image->height << 16)/newHeight) + 1;

    int x2, y2;
    for (int y = 0; y < newHeight; y++)
    {
        for (int x = 0; x < newWidth; x++)
        {
            x2 = ((x*xRatio) >> 16);
            y2 = ((y*yRatio) >> 16);

            output[(y*newWidth) + x] = pixels[(y2*image->width) + x2] ;
        }
    }

    int format = image->format;

    RL_FREE(image->data);

    image->data = output;
    image->width = newWidth;
    image->height = newHeight;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);  // Reformat 32bit RGBA image to original format

    UnloadImageColors(pixels);
}